

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_self_test(int verbose)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *__s;
  uchar header [2];
  uchar acc [64];
  uchar buf [64];
  mbedtls_entropy_context ctx;
  uchar local_4aa [2];
  ulong local_4a8 [16];
  mbedtls_entropy_context local_428;
  
  local_4a8[0xe] = 0;
  local_4a8[0xf] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  if (verbose != 0) {
    printf("  ENTROPY test: ");
  }
  mbedtls_entropy_init(&local_428);
  iVar1 = entropy_gather_internal(&local_428);
  if (iVar1 == 0) {
    lVar3 = (long)local_428.source_count;
    iVar1 = 1;
    if (lVar3 < 0x14) {
      local_428.source[lVar3].f_source = entropy_dummy_source;
      local_428.source[lVar3].p_source = (void *)0x0;
      local_428.source[lVar3].threshold = 0x10;
      local_428.source[lVar3].strong = 0;
      local_428.source_count = local_428.source_count + 1;
      local_4aa[0] = '\x14';
      local_4aa[1] = '@';
      mbedtls_sha512_update(&local_428.accumulator,local_4aa,2);
      mbedtls_sha512_update(&local_428.accumulator,(uchar *)(local_4a8 + 8),0x40);
      lVar3 = 0;
      do {
        iVar2 = mbedtls_entropy_func(&local_428,(uchar *)(local_4a8 + 8),0x40);
        if (iVar2 != 0) goto LAB_001bb3c7;
        lVar4 = 0;
        do {
          *(ulong *)((long)local_4a8 + lVar4) =
               *(ulong *)((long)local_4a8 + lVar4) | *(ulong *)((long)local_4a8 + lVar4 + 0x40);
          *(ulong *)((long)local_4a8 + lVar4 + 8) =
               *(ulong *)((long)local_4a8 + lVar4 + 8) | *(ulong *)((long)local_4a8 + lVar4 + 0x48);
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x40);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      lVar3 = 0;
      do {
        if (*(char *)((long)local_4a8 + lVar3) == '\0') goto LAB_001bb3c7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      iVar1 = 0;
    }
  }
LAB_001bb3c7:
  lVar3 = 0;
  do {
    *(undefined1 *)((long)local_428.accumulator.total + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  if (verbose != 0) {
    __s = "failed";
    if (iVar1 == 0) {
      __s = "passed";
    }
    puts(__s);
    putchar(10);
  }
  return (int)(iVar1 != 0);
}

Assistant:

int mbedtls_entropy_self_test( int verbose )
{
    int ret = 0;
    mbedtls_entropy_context ctx;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    unsigned char acc[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    size_t i, j;

    if( verbose != 0 )
        mbedtls_printf( "  ENTROPY test: " );

    mbedtls_entropy_init( &ctx );

    /* First do a gather to make sure we have default sources */
    if( ( ret = mbedtls_entropy_gather( &ctx ) ) != 0 )
        goto cleanup;

    ret = mbedtls_entropy_add_source( &ctx, entropy_dummy_source, NULL, 16,
                                      MBEDTLS_ENTROPY_SOURCE_WEAK );
    if( ret != 0 )
        goto cleanup;

    if( ( ret = mbedtls_entropy_update_manual( &ctx, buf, sizeof buf ) ) != 0 )
        goto cleanup;

    /*
     * To test that mbedtls_entropy_func writes correct number of bytes:
     * - use the whole buffer and rely on ASan to detect overruns
     * - collect entropy 8 times and OR the result in an accumulator:
     *   any byte should then be 0 with probably 2^(-64), so requiring
     *   each of the 32 or 64 bytes to be non-zero has a false failure rate
     *   of at most 2^(-58) which is acceptable.
     */
    for( i = 0; i < 8; i++ )
    {
        if( ( ret = mbedtls_entropy_func( &ctx, buf, sizeof( buf ) ) ) != 0 )
            goto cleanup;

        for( j = 0; j < sizeof( buf ); j++ )
            acc[j] |= buf[j];
    }

    for( j = 0; j < sizeof( buf ); j++ )
    {
        if( acc[j] == 0 )
        {
            ret = 1;
            goto cleanup;
        }
    }

cleanup:
    mbedtls_entropy_free( &ctx );

    if( verbose != 0 )
    {
        if( ret != 0 )
            mbedtls_printf( "failed\n" );
        else
            mbedtls_printf( "passed\n" );

        mbedtls_printf( "\n" );
    }

    return( ret != 0 );
}